

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bcatblk(bstring b,uchar *s,int len)

{
  int iVar1;
  undefined1 local_38 [4];
  int nl;
  tagbstring t;
  int len_local;
  uchar *s_local;
  bstring b_local;
  
  if ((((b == (bstring)0x0) || (b->data == (uchar *)0x0)) || (b->slen < 0)) ||
     (((b->mlen < b->slen || (b->mlen < 1)) || ((s == (uchar *)0x0 || (len < 0)))))) {
    b_local._4_4_ = -1;
  }
  else {
    iVar1 = b->slen + len;
    if (iVar1 < 0) {
      b_local._4_4_ = -1;
    }
    else {
      t.data._4_4_ = len;
      if (iVar1 < b->mlen) {
        if (0 < len) {
          memmove(b->data + b->slen,s,(long)len);
        }
        b->slen = iVar1;
        b->data[iVar1] = '\0';
        b_local._4_4_ = 0;
      }
      else {
        local_38 = (undefined1  [4])0xffffffff;
        nl = len;
        t._0_8_ = s;
        b_local._4_4_ = bconcat(b,(bstring)local_38);
      }
    }
  }
  return b_local._4_4_;
}

Assistant:

int bcatblk (bstring b, const unsigned char * s, int len) {
struct tagbstring t;
int nl;

	if (b == NULL || b->data == NULL || b->slen < 0 || b->mlen < b->slen
	 || b->mlen <= 0 || s == NULL || len < 0) return BSTR_ERR;

	if ((nl = b->slen + len) < 0) return BSTR_ERR; /* Overflow? */
	if (nl < b->mlen) {
		bBlockCopy (&b->data[b->slen], s, len);
		b->slen = nl;
		b->data[nl] = '\0';
		return BSTR_OK;
	}
	blk2tbstr (t, s, len);
	return bconcat (b, &t);
}